

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O1

bool __thiscall SRUP_MSG::VerifyF(SRUP_MSG *this,char *keyfile)

{
  bool bVar1;
  int iVar2;
  SRUP_Crypto Crypto;
  SRUP_Crypto local_40;
  
  iVar2 = (*this->_vptr_SRUP_MSG[9])();
  if ((char)iVar2 == '\0') {
    bVar1 = false;
  }
  else {
    SRUP_Crypto::SRUP_Crypto(&local_40);
    SRUP_Crypto::signature(&local_40,this->m_signature,this->m_sig_len);
    (*this->_vptr_SRUP_MSG[10])(this,1);
    bVar1 = SRUP_Crypto::VerifyF
                      (&local_40,this->m_unsigned_message,(ulong)this->m_unsigned_length,keyfile);
    SRUP_Crypto::~SRUP_Crypto(&local_40);
  }
  return bVar1;
}

Assistant:

bool SRUP_MSG::VerifyF(char *keyfile)
{
    if (!DataCheck())
        return false;

    SRUP_Crypto Crypto;
    Crypto.signature(m_signature, m_sig_len);
    Serialize(true);
    return Crypto.VerifyF(m_unsigned_message, m_unsigned_length, keyfile);
}